

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall ViconDataStreamSDK::Core::VClient::ClearSubjectFilter(VClient *this)

{
  element_type *peVar1;
  VClient *this_local;
  
  ViconCGStream::VFilter::Clear(&this->m_Filter,2);
  ViconCGStream::VFilter::Clear(&this->m_Filter,9);
  ViconCGStream::VFilter::Clear(&this->m_Filter,8);
  ViconCGStream::VFilter::Clear(&this->m_Filter,0x385);
  ViconCGStream::VFilter::Clear(&this->m_Filter,0x6d61);
  ViconCGStream::VFilter::Clear(&this->m_Filter,0x1c);
  peVar1 = std::
           __shared_ptr_access<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_pClient);
  (*peVar1->_vptr_ICGClient[0xc])(peVar1,&this->m_Filter);
  return Success;
}

Assistant:

Result::Enum VClient::ClearSubjectFilter()
{
  m_Filter.Clear(ViconCGStreamEnum::SubjectInfo);
  m_Filter.Clear( ViconCGStreamEnum::GlobalSegments );
  m_Filter.Clear( ViconCGStreamEnum::LocalSegments );
  m_Filter.Clear( ViconCGStreamEnum::LightweightSegments );
  m_Filter.Clear( ViconCGStreamEnum::SubjectScale );
  m_Filter.Clear( ViconCGStreamEnum::SubjectTopology );

  m_pClient->SetFilter(m_Filter);

  return Result::Success;
}